

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream.h
# Opt level: O3

buffer_appender<char> __thiscall
fmt::v7::detail::fallback_formatter<std::_Put_time<char>,char,void>::
format<fmt::v7::detail::buffer_appender<char>>
          (fallback_formatter<std::_Put_time<char>,char,void> *this,_Put_time<char> *value,
          basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *ctx)

{
  iterator iVar1;
  basic_string_view<char> str;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  basic_string_view<char> local_240;
  buffer<char> local_230;
  char local_210 [504];
  
  local_230.size_ = 0;
  local_230._vptr_buffer = (_func_int **)&PTR_grow_007a24a8;
  local_230.capacity_ = 500;
  local_230.ptr_ = local_210;
  format_value<char,std::_Put_time<char>>(&local_230,value,(locale_ref)(ctx->loc_).locale_);
  local_240.data_ = local_230.ptr_;
  local_240.size_ = local_230.size_;
  iVar1 = formatter<fmt::v7::basic_string_view<char>,char,void>::
          format<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>
                    ((formatter<fmt::v7::basic_string_view<char>,char,void> *)this,&local_240,ctx);
  if (local_230.ptr_ != local_210) {
    operator_delete(local_230.ptr_,local_230.capacity_);
  }
  return (buffer_appender<char>)
         iVar1.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
}

Assistant:

auto format(const T& value, basic_format_context<OutputIt, Char>& ctx)
      -> OutputIt {
    basic_memory_buffer<Char> buffer;
    format_value(buffer, value, ctx.locale());
    basic_string_view<Char> str(buffer.data(), buffer.size());
    return formatter<basic_string_view<Char>, Char>::format(str, ctx);
  }